

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3DeclareVtab(int *pRc,Fts3Table *p)

{
  bool bVar1;
  char *zCreateTable;
  char *local_40;
  char *zLanguageid;
  char *zCols;
  char *zSql;
  int rc;
  int i;
  Fts3Table *p_local;
  int *pRc_local;
  
  if (*pRc == 0) {
    if (p->zLanguageid == (char *)0x0) {
      local_40 = "__langid";
    }
    else {
      local_40 = p->zLanguageid;
    }
    sqlite3_vtab_config(p->db,1);
    zLanguageid = sqlite3_mprintf("%Q, ",*p->azColumn);
    zSql._4_4_ = 1;
    while( true ) {
      bVar1 = false;
      if (zLanguageid != (char *)0x0) {
        bVar1 = zSql._4_4_ < p->nColumn;
      }
      if (!bVar1) break;
      zLanguageid = sqlite3_mprintf("%z%Q, ",zLanguageid,p->azColumn[zSql._4_4_]);
      zSql._4_4_ = zSql._4_4_ + 1;
    }
    zCreateTable = sqlite3_mprintf("CREATE TABLE x(%s %Q HIDDEN, docid HIDDEN, %Q HIDDEN)",
                                   zLanguageid,p->zName,local_40);
    if ((zLanguageid == (char *)0x0) || (zCreateTable == (char *)0x0)) {
      zSql._0_4_ = 7;
    }
    else {
      zSql._0_4_ = sqlite3_declare_vtab(p->db,zCreateTable);
    }
    sqlite3_free(zCreateTable);
    sqlite3_free(zLanguageid);
    *pRc = (int)zSql;
  }
  return;
}

Assistant:

static void fts3DeclareVtab(int *pRc, Fts3Table *p){
  if( *pRc==SQLITE_OK ){
    int i;                        /* Iterator variable */
    int rc;                       /* Return code */
    char *zSql;                   /* SQL statement passed to declare_vtab() */
    char *zCols;                  /* List of user defined columns */
    const char *zLanguageid;

    zLanguageid = (p->zLanguageid ? p->zLanguageid : "__langid");
    sqlite3_vtab_config(p->db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);

    /* Create a list of user columns for the virtual table */
    zCols = sqlite3_mprintf("%Q, ", p->azColumn[0]);
    for(i=1; zCols && i<p->nColumn; i++){
      zCols = sqlite3_mprintf("%z%Q, ", zCols, p->azColumn[i]);
    }

    /* Create the whole "CREATE TABLE" statement to pass to SQLite */
    zSql = sqlite3_mprintf(
        "CREATE TABLE x(%s %Q HIDDEN, docid HIDDEN, %Q HIDDEN)", 
        zCols, p->zName, zLanguageid
    );
    if( !zCols || !zSql ){
      rc = SQLITE_NOMEM;
    }else{
      rc = sqlite3_declare_vtab(p->db, zSql);
    }

    sqlite3_free(zSql);
    sqlite3_free(zCols);
    *pRc = rc;
  }
}